

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::Append
          (ColumnData *this,BaseStatistics *append_stats,ColumnAppendState *state,Vector *vector,
          idx_t append_count)

{
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat UStack_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&UStack_78);
  Vector::ToUnifiedFormat(vector,append_count,&UStack_78);
  (*this->_vptr_ColumnData[0x13])(this,append_stats,state,&UStack_78,append_count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&UStack_78);
  return;
}

Assistant:

void ColumnData::Append(BaseStatistics &append_stats, ColumnAppendState &state, Vector &vector, idx_t append_count) {
	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(append_count, vdata);
	AppendData(append_stats, state, vdata, append_count);
}